

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void OpenSteer::deferredDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  Color *in_stack_00000050;
  Vec3 *in_stack_00000058;
  Vec3 *in_stack_00000060;
  
  anon_unknown.dwarf_1485b::DeferredLine::addToBuffer
            (in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return;
}

Assistant:

void 
OpenSteer::deferredDrawLine (const Vec3& startPoint,
                             const Vec3& endPoint,
                             const Color& color)
{
    DeferredLine::addToBuffer (startPoint, endPoint, color);
}